

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parseInstrument(Parser *this,QString *data,qsizetype offset)

{
  Data *pDVar1;
  char16_t *pcVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  qsizetype qVar7;
  qsizetype qVar8;
  QString *str;
  QString *str_00;
  QString *str_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_120;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_a8;
  Function local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = QString::indexOf(data,(QChar)0x28,offset,CaseSensitive);
  uVar6 = QString::indexOf(data,(QChar)0x29,uVar5,CaseSensitive);
  local_88.functionParameters.d.d = (Data *)0x0;
  local_88.functionParameters.d.ptr = (char16_t *)0x0;
  local_88.functionName.d.ptr = (char16_t *)0x0;
  local_88.functionName.d.size = 0;
  local_88.className.d.size = 0;
  local_88.functionName.d.d = (Data *)0x0;
  local_88.className.d.d = (Data *)0x0;
  local_88.className.d.ptr = (char16_t *)0x0;
  local_88.functionParameters.d.size = 0;
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::mid((QString *)&local_c8,data,uVar5 + 1,~uVar5 + uVar6);
  QString::simplified_helper((QString *)&local_a8,(QString *)&local_c8,str);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  bVar3 = operator!=((QString *)&local_a8,&this->m_provider);
  if (!bVar3) {
    local_c8.d = (Data *)0x0;
    local_e8.d = (Data *)0x0;
    local_e8.ptr = (char16_t *)0x0;
    local_c8.ptr = L"::";
    local_e8.size = 0;
    local_c8.size = 2;
    qVar7 = QString::indexOf(data,(QString *)&local_c8,uVar6,CaseSensitive);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
    qVar8 = QString::indexOf(data,(QChar)0x7b,qVar7,CaseSensitive);
    local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::mid((QString *)&local_c8,data,uVar6 + 1,~uVar6 + qVar7);
    local_e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::mid((QString *)&local_e8,data,qVar7 + 2,(qVar8 - qVar7) + -2);
    qVar7 = QString::lastIndexOf((QString *)&local_c8,(QChar)0x20,CaseSensitive);
    iVar4 = (int)qVar7;
    if (iVar4 == -1) {
      QString::operator=(&local_88.className,(QString *)&local_c8);
    }
    else {
      QString::mid((QString *)&local_108,(QString *)&local_c8,(long)(iVar4 + 1),
                   (qsizetype)(local_c8.size + ~(long)iVar4));
      qVar7 = local_88.className.d.size;
      pcVar2 = local_88.className.d.ptr;
      pDVar1 = local_88.className.d.d;
      local_88.className.d.d = local_108.d;
      local_88.className.d.ptr = local_108.ptr;
      local_108.d = pDVar1;
      local_108.ptr = pcVar2;
      local_88.className.d.size = local_108.size;
      local_108.size = qVar7;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    }
    uVar6 = QString::indexOf((QString *)&local_e8,(QChar)0x28,0,CaseSensitive);
    qVar7 = QString::indexOf((QString *)&local_e8,(QChar)0x20,0,CaseSensitive);
    uVar5 = (long)(int)qVar7;
    if ((long)uVar6 <= (long)(int)qVar7) {
      uVar5 = uVar6;
    }
    QString::left((QString *)&local_120,(QString *)&local_e8,uVar5);
    QString::simplified_helper((QString *)&local_108,(QString *)&local_120,str_00);
    qVar7 = local_88.functionName.d.size;
    pcVar2 = local_88.functionName.d.ptr;
    pDVar1 = local_88.functionName.d.d;
    local_88.functionName.d.d = local_108.d;
    local_88.functionName.d.ptr = local_108.ptr;
    local_108.d = pDVar1;
    local_108.ptr = pcVar2;
    local_88.functionName.d.size = local_108.size;
    local_108.size = qVar7;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
    qVar7 = QString::lastIndexOf((QString *)&local_e8,(QChar)0x29,CaseSensitive);
    QString::mid((QString *)&local_120,(QString *)&local_e8,uVar6 + 1,~uVar6 + qVar7);
    QString::simplified_helper((QString *)&local_108,(QString *)&local_120,str_01);
    qVar7 = local_88.functionParameters.d.size;
    pcVar2 = local_88.functionParameters.d.ptr;
    pDVar1 = local_88.functionParameters.d.d;
    local_88.functionParameters.d.d = local_108.d;
    local_88.functionParameters.d.ptr = local_108.ptr;
    local_108.d = pDVar1;
    local_108.ptr = pcVar2;
    local_88.functionParameters.d.size = local_108.size;
    local_108.size = qVar7;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
    QList<Function>::emplaceBack<Function_const&>(&this->m_functions,&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  Function::~Function(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::parseInstrument(const QString &data, qsizetype offset)
{
    qsizetype beginOfProvider = data.indexOf(QLatin1Char('('), offset);
    qsizetype endOfProvider = data.indexOf(QLatin1Char(')'), beginOfProvider);
    Function func;
    QString provider = data.mid(beginOfProvider + 1, endOfProvider - beginOfProvider - 1).simplified();
    if (provider != m_provider)
        return;

    qsizetype classMarker = data.indexOf(QStringLiteral("::"), endOfProvider);
    qsizetype beginOfFunctionMarker = data.indexOf(QLatin1Char('{'), classMarker);
    QString begin = data.mid(endOfProvider + 1, classMarker - endOfProvider - 1);
    QString end = data.mid(classMarker + 2, beginOfFunctionMarker - classMarker - 2);
    int spaceIndex = begin.lastIndexOf(QLatin1Char(' '));
    if (spaceIndex == -1)
        func.className = begin;
    else
        func.className = begin.mid(spaceIndex + 1, begin.length() - spaceIndex - 1);
    qsizetype braceIndex = end.indexOf(QLatin1Char('('));
    spaceIndex = end.indexOf(QLatin1Char(' '));
    if (spaceIndex < braceIndex)
        func.functionName = end.left(spaceIndex).simplified();
    else
        func.functionName = end.left(braceIndex).simplified();

    qsizetype lastBraceIndex = end.lastIndexOf(QLatin1Char(')'));
    func.functionParameters = end.mid(braceIndex + 1, lastBraceIndex - braceIndex - 1).simplified();

    DEBUGPRINTF(printf("tracepointgen: %s(%s)\n", qPrintable(func.functionName), qPrintable(func.functionParameters)));

    m_functions.push_back(func);
}